

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo1.cpp
# Opt level: O3

int256_t * __thiscall primesum::pi_lmo1(int256_t *__return_storage_ptr__,primesum *this,int128_t x)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  long lVar10;
  int128_t *piVar11;
  ulong uVar12;
  ulong uVar13;
  long in_RDX;
  ulong extraout_RDX;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  int128_t *piVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int256_t p2;
  vector<int,_std::allocator<int>_> primes;
  vector<int,_std::allocator<int>_> mu;
  vector<int,_std::allocator<int>_> lpf;
  long local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  int256_t local_108;
  int64_t local_e0;
  int128_t *local_d8;
  vector<int,_std::allocator<int>_> local_d0;
  int256_t local_b8;
  vector<int,_std::allocator<int>_> local_98;
  vector<int,_std::allocator<int>_> local_80;
  int256_t *local_68;
  long local_60;
  int256_t local_58;
  
  if (-in_RDX < (long)(ulong)((primesum *)0x1 < this)) {
    local_68 = __return_storage_ptr__;
    dVar9 = (double)__floattidf(this);
    dVar9 = pow(dVar9,0.3333333333333333);
    auVar30 = __fixdfti(SUB84(dVar9,0));
    if ((long)(ulong)(auVar30._0_8_ == 0) <= auVar30._8_8_) {
      do {
        lVar16 = auVar30._8_8_;
        uVar12 = auVar30._0_8_;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = uVar12;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar12;
        lVar15 = SUB168(auVar32 * auVar4,8) + uVar12 * lVar16 * 2;
        auVar31 = __divti3(this,in_RDX,uVar12,lVar16);
        uVar14 = (ulong)(auVar31._0_8_ < SUB168(auVar32 * auVar4,0));
        lVar23 = auVar31._8_8_ - lVar15;
        if ((SBORROW8(auVar31._8_8_,lVar15) != SBORROW8(lVar23,uVar14)) ==
            (long)(lVar23 - uVar14) < 0) goto LAB_0011ef65;
        auVar30._8_8_ = lVar16 + -1 + (ulong)(uVar12 != 0);
        auVar30._0_8_ = uVar12 - 1;
      } while (-lVar16 < (long)(ulong)(1 < uVar12));
      auVar30 = ZEXT816(0);
    }
LAB_0011ef65:
    lVar23 = auVar30._0_8_ + -1;
    do {
      piVar11 = auVar30._0_8_;
      uVar14 = (long)piVar11 + 1;
      lVar15 = auVar30._8_8_ + (ulong)((int128_t *)0xfffffffffffffffe < piVar11);
      auVar30._8_8_ = lVar15;
      auVar30._0_8_ = uVar14;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = uVar14;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar14;
      lVar16 = SUB168(auVar31 * auVar5,8) + uVar14 * lVar15 * 2;
      auVar32 = __divti3(this,in_RDX,uVar14,lVar15);
      lVar23 = lVar23 + 1;
      uVar14 = (ulong)(auVar32._0_8_ < SUB168(auVar31 * auVar5,0));
      lVar15 = auVar32._8_8_ - lVar16;
    } while ((SBORROW8(auVar32._8_8_,lVar16) != SBORROW8(lVar15,uVar14)) ==
             (long)(lVar15 - uVar14) < 0);
    local_e0 = pi_legendre((int64_t)piVar11,1);
    lVar15 = 6;
    if ((long)piVar11 < 0xd) {
      lVar15 = (long)(int)(&PhiTiny::pi)[(long)piVar11];
    }
    generate_primes(&local_d0,(int64_t)piVar11);
    generate_lpf(&local_80,(int64_t)piVar11);
    generate_moebius(&local_98,(int64_t)piVar11);
    local_d8 = piVar11;
    if ((long)piVar11 < 1) {
      local_120 = 0;
      local_128 = 0;
      local_130 = 0;
      local_138 = 0;
    }
    else {
      local_130 = 0;
      local_138 = 0;
      local_120 = 0;
      local_128 = 0;
      lVar16 = 0;
      do {
        lVar10 = lVar16 + 1;
        if (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar15] <
            local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar16 + 1]) {
          auVar30 = __udivti3(this,in_RDX,lVar10,0);
          x_00._8_8_ = in_RDX;
          x_00._0_8_ = this;
          phi_sum(&local_58,auVar30._0_8_,(int128_t)x_00,auVar30._8_8_);
          local_108.low._0_8_ =
               local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar16 + 1] * lVar10;
          local_108.low._8_8_ = (long)(ulong)local_108.low >> 0x3f;
          local_108.high._0_8_ = local_108.low._8_8_;
          local_108.high._8_8_ = local_108.low._8_8_;
          int256_t::operator*(&local_b8,&local_58,&local_108);
          bVar27 = CARRY8(local_130,(ulong)local_b8.high);
          uVar12 = local_130 + (ulong)local_b8.high;
          bVar28 = CARRY8(local_120,(ulong)local_b8.low);
          local_120 = local_120 + (ulong)local_b8.low;
          bVar29 = CARRY8(local_128,local_b8.low._8_8_);
          uVar14 = local_128 + local_b8.low._8_8_;
          local_128 = uVar14 + bVar28;
          uVar14 = (ulong)(bVar29 || CARRY8(uVar14,(ulong)bVar28));
          local_130 = uVar12 + uVar14;
          local_138 = local_138 + local_b8.high._8_8_ + (ulong)bVar27 + (ulong)CARRY8(uVar12,uVar14)
          ;
          piVar11 = local_d8;
        }
        lVar16 = lVar10;
      } while (lVar23 != lVar10);
    }
    local_118 = 0;
    local_110 = 0;
    uVar14 = 0;
    lVar23 = 0;
    if (lVar15 + 1 < local_e0) {
      uVar14 = 0;
      lVar23 = 0;
      local_118 = 0;
      local_110 = 0;
      lVar16 = lVar15 + 1;
      do {
        lVar10 = lVar16;
        local_60 = lVar15;
        if ((long)piVar11 /
            (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar10] < (long)piVar11) {
          piVar19 = (int128_t *)
                    ((long)piVar11 /
                     (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar10] + 1);
          lVar15 = (long)piVar19 >> 0x3f;
          do {
            if (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar10] <
                local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(long)piVar19]) {
              uVar12 = (ulong)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar10];
              auVar1._8_8_ = 0;
              auVar1._0_8_ = piVar19;
              auVar6._8_8_ = 0;
              auVar6._0_8_ = uVar12;
              auVar30 = __divti3(this,in_RDX,SUB168(auVar1 * auVar6,0),
                                 uVar12 * lVar15 + SUB168(auVar1 * auVar6,8) +
                                 ((long)uVar12 >> 0x3f) * (long)piVar19);
              x_01._8_8_ = in_RDX;
              x_01._0_8_ = this;
              phi_sum(&local_58,auVar30._0_8_,(int128_t)x_01,auVar30._8_8_);
              uVar17 = (ulong)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[(long)piVar19];
              auVar2._8_8_ = 0;
              auVar2._0_8_ = piVar19;
              auVar7._8_8_ = 0;
              auVar7._0_8_ = uVar17;
              uVar12 = SUB168(auVar2 * auVar7,0);
              uVar18 = (ulong)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar10];
              auVar3._8_8_ = 0;
              auVar3._0_8_ = uVar12;
              auVar8._8_8_ = 0;
              auVar8._0_8_ = uVar18;
              local_108.low._0_8_ = SUB168(auVar3 * auVar8,0);
              local_108.low._8_8_ =
                   (uVar17 * lVar15 + SUB168(auVar2 * auVar7,8) +
                   ((long)uVar17 >> 0x3f) * (long)piVar19) * uVar18 +
                   SUB168(auVar3 * auVar8,8) + ((long)uVar18 >> 0x3f) * uVar12;
              local_108.high._0_8_ = (long)local_108.low._8_8_ >> 0x3f;
              local_108.high._8_8_ = (ulong)local_108.high;
              int256_t::operator*(&local_b8,&local_58,&local_108);
              bVar27 = uVar14 < (ulong)local_b8.high;
              uVar17 = uVar14 - (ulong)local_b8.high;
              bVar28 = local_118 < (ulong)local_b8.low;
              local_118 = local_118 - (ulong)local_b8.low;
              bVar29 = local_110 < local_b8.low._8_8_;
              uVar14 = local_110 - local_b8.low._8_8_;
              local_110 = uVar14 - bVar28;
              uVar12 = (ulong)(bVar29 || uVar14 < bVar28);
              uVar14 = uVar17 - uVar12;
              lVar23 = ((lVar23 - local_b8.high._8_8_) - (ulong)bVar27) - (ulong)(uVar17 < uVar12);
              piVar11 = local_d8;
            }
            bVar27 = (int128_t *)0xfffffffffffffffe < piVar19;
            bVar28 = piVar19 < piVar11;
            bVar29 = SBORROW8(lVar15,(long)piVar11 >> 0x3f);
            lVar16 = lVar15 - ((long)piVar11 >> 0x3f);
            piVar19 = (int128_t *)((long)piVar19 + 1);
            lVar15 = lVar15 + (ulong)bVar27;
          } while ((bVar29 != SBORROW8(lVar16,(ulong)bVar28)) != (long)(lVar16 - (ulong)bVar28) < 0)
          ;
        }
        lVar16 = lVar10 + 1;
        lVar15 = lVar10;
      } while (lVar10 + 1 != local_e0);
    }
    uVar20 = local_110 + local_128 + (ulong)CARRY8(local_118,local_120);
    uVar12 = (ulong)(CARRY8(local_110,local_128) ||
                    CARRY8(local_110 + local_128,(ulong)CARRY8(local_118,local_120)));
    uVar24 = uVar14 + local_130 + uVar12;
    x_02._8_8_ = in_RDX;
    x_02._0_8_ = this;
    P2(&local_108,this,(int128_t)x_02,in_RDX,(int)piVar11);
    piVar11 = prime_sum_tiny(piVar11,(int64_t)this);
    __return_storage_ptr__ = local_68;
    uVar13 = (long)extraout_RDX >> 0x3f;
    uVar25 = uVar24 + uVar13;
    lVar15 = (long)piVar11 + local_118 + local_120;
    uVar17 = (ulong)CARRY8((ulong)piVar11,local_118 + local_120);
    uVar18 = uVar20 + extraout_RDX;
    uVar21 = uVar18 + uVar17;
    uVar17 = (ulong)(CARRY8(uVar20,extraout_RDX) || CARRY8(uVar18,uVar17));
    uVar26 = uVar25 + uVar17;
    uVar20 = lVar15 - 1;
    uVar18 = (ulong)(lVar15 == 0);
    uVar22 = uVar21 - uVar18;
    uVar18 = (ulong)(uVar21 < uVar18);
    uVar21 = uVar26 - uVar18;
    lVar15 = uVar21 - (ulong)local_108.high;
    lVar23 = (((lVar23 + local_138 + (ulong)CARRY8(uVar14,local_130) +
                (ulong)CARRY8(uVar14 + local_130,uVar12) + uVar13 + (ulong)CARRY8(uVar24,uVar13) +
               (ulong)CARRY8(uVar25,uVar17)) - (ulong)(uVar26 < uVar18)) - local_108.high._8_8_) -
             (ulong)(uVar21 < (ulong)local_108.high);
    uVar14 = (ulong)(uVar20 < (ulong)local_108.low);
    uVar12 = uVar22 - local_108.low._8_8_;
    *(long *)&local_68->high = lVar15;
    *(long *)((long)&local_68->high + 8) = lVar23;
    *(ulong *)&local_68->low = uVar20 - (ulong)local_108.low;
    *(ulong *)((long)&local_68->low + 8) = uVar12 - uVar14;
    if (uVar22 < local_108.low._8_8_ || uVar12 < uVar14) {
      *(long *)&local_68->high = lVar15 + -1;
      *(ulong *)((long)&local_68->high + 8) = lVar23 + -1 + (ulong)(lVar15 != 0);
    }
    if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    *(undefined8 *)&__return_storage_ptr__->high = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->high + 8) = 0;
    *(undefined8 *)&__return_storage_ptr__->low = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->low + 8) = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

int256_t pi_lmo1(int128_t x)
{
  if (x < 2)
    return 0;

  int64_t y = iroot<3>(x); 
  int64_t pi_y = pi_legendre(y, 1);
  int64_t c = PhiTiny::get_c(y);
  int256_t S1 = 0;
  int256_t S2 = 0;

  vector<int32_t> primes = generate_primes(y);
  vector<int32_t> lpf = generate_lpf(y);
  vector<int32_t> mu = generate_moebius(y);

  // Calculate the contribution of the ordinary leaves
  for (int64_t n = 1; n <= y; n++)
    if (lpf[n] > primes[c])
      S1 += phi_sum(x / n, c) * (mu[n] * n);
  
  // Calculate the contribution of the special leaves
  for (int64_t b = c + 1; b < pi_y; b++)
    for (int128_t m = (y / primes[b]) + 1; m <= y; m++)
      if (lpf[m] > primes[b])
        S2 -= phi_sum(x / (primes[b] * m), b - 1) * (mu[m] * m * primes[b]);

  int256_t phi = S1 + S2;
  int256_t p2 = P2(x, y, 1);
  int256_t sum = phi + prime_sum_tiny(y) - 1 - p2;

  return sum;
}